

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::degree_sort
          (HomomorphismSearcher *this,vector<int,_std::allocator<int>_> *branch_v,uint branch_v_end,
          bool reverse)

{
  anon_class_16_2_6f60f2f3 __comp;
  undefined1 in_CL;
  undefined4 in_EDX;
  HomomorphismSearcher *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> unaff_retaddr;
  difference_type in_stack_ffffffffffffffc0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  
  uVar1 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  __last._M_current = (int *)in_RDI;
  std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  __comp.reverse._4_4_ = in_EDX;
  __comp.reverse._0_4_ = uVar1;
  __comp.this = in_RSI;
  std::
  stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,gss::innards::HomomorphismSearcher::degree_sort(std::vector<int,std::allocator<int>>&,unsigned_int,bool)::__0>
            (unaff_retaddr,__last,__comp);
  return;
}

Assistant:

auto HomomorphismSearcher::degree_sort(
    vector<int> & branch_v,
    unsigned branch_v_end,
    bool reverse) -> void
{
    stable_sort(branch_v.begin(), branch_v.begin() + branch_v_end, [&](int a, int b) -> bool {
        return reverse
            ? model.target_degree(0, a) < model.target_degree(0, b)
            : -model.target_degree(0, a) < -model.target_degree(0, b);
    });
}